

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_nlzc_h_mips(CPUMIPSState *env,uint32_t wd,uint32_t ws)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((env->active_fpu).fpr + ws));
  *(short *)((env->active_fpu).fpr + wd) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 2));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 2) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 4));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 4) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 6));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 6) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 8));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 8) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 10));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 10) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xc));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xc) = (short)iVar1;
  iVar1 = msa_nlzc_df(1,(long)*(short *)((long)(env->active_fpu).fpr + lVar3 + 0xe));
  *(short *)((long)(env->active_fpu).fpr + lVar2 + 0xe) = (short)iVar1;
  return;
}

Assistant:

void helper_msa_nlzc_h(CPUMIPSState *env, uint32_t wd, uint32_t ws)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);

    pwd->h[0]  = msa_nlzc_df(DF_HALF, pws->h[0]);
    pwd->h[1]  = msa_nlzc_df(DF_HALF, pws->h[1]);
    pwd->h[2]  = msa_nlzc_df(DF_HALF, pws->h[2]);
    pwd->h[3]  = msa_nlzc_df(DF_HALF, pws->h[3]);
    pwd->h[4]  = msa_nlzc_df(DF_HALF, pws->h[4]);
    pwd->h[5]  = msa_nlzc_df(DF_HALF, pws->h[5]);
    pwd->h[6]  = msa_nlzc_df(DF_HALF, pws->h[6]);
    pwd->h[7]  = msa_nlzc_df(DF_HALF, pws->h[7]);
}